

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::RandomShaderTests::init(RandomShaderTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  RandomShaderTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::BasicExpressionGroup::BasicExpressionGroup
            ((BasicExpressionGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::ScalarConversionGroup::ScalarConversionGroup
            ((ScalarConversionGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::SwizzleGroup::SwizzleGroup
            ((SwizzleGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::ComparisonOpsGroup::ComparisonOpsGroup
            ((ComparisonOpsGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::ConditionalsGroup::ConditionalsGroup
            ((ConditionalsGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TrigonometricGroup::TrigonometricGroup
            ((TrigonometricGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::ExponentialGroup::ExponentialGroup
            ((ExponentialGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TextureGroup::TextureGroup
            ((TextureGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::AllFeaturesGroup::AllFeaturesGroup
            ((AllFeaturesGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void RandomShaderTests::init (void)
{
	addChild(new BasicExpressionGroup	(m_context));
	addChild(new ScalarConversionGroup	(m_context));
	addChild(new SwizzleGroup			(m_context));
	addChild(new ComparisonOpsGroup		(m_context));
	addChild(new ConditionalsGroup		(m_context));
	addChild(new TrigonometricGroup		(m_context));
	addChild(new ExponentialGroup		(m_context));
	addChild(new TextureGroup			(m_context));
	addChild(new AllFeaturesGroup		(m_context));
}